

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spfgmr.c
# Opt level: O0

int SUNLinSolSolve_SPFGMR(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,sunrealtype delta)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  double *pdVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  code *pcVar15;
  code *pcVar16;
  long lVar17;
  undefined8 *puVar18;
  undefined8 *puVar19;
  bool bVar20;
  int iVar21;
  int *piVar22;
  int *piVar23;
  undefined4 uVar24;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long *in_RDI;
  bool bVar25;
  double in_XMM0_Qa;
  double __x;
  N_Vector *Xv;
  sunrealtype *cv;
  int status;
  SUNPSolveFn psolve;
  SUNATimesFn atimes;
  void *P_data;
  void *A_data;
  int *nli;
  int gstype;
  int max_restarts;
  int ntries;
  int krydim;
  int l_max;
  int l;
  int k;
  int j;
  int i;
  int *zeroguess;
  int converged;
  int scale2;
  int scale1;
  int preOnRight;
  sunrealtype rho;
  sunrealtype s_product;
  sunrealtype r_norm;
  sunrealtype rotation_product;
  sunrealtype beta;
  sunrealtype *res_norm;
  sunrealtype *yg;
  sunrealtype *givens;
  sunrealtype **Hes;
  N_Vector s2;
  N_Vector s1;
  N_Vector vtemp;
  N_Vector xcor;
  N_Vector *Z;
  N_Vector *V;
  SUNContext_conflict sunctx_local_scope_;
  double local_140;
  int local_e4;
  int local_e0;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  int local_4;
  
  local_e0 = 0;
  iVar1 = *(int *)*in_RDI;
  iVar2 = *(int *)(*in_RDI + 0xc);
  iVar3 = *(int *)(*in_RDI + 8);
  puVar4 = *(undefined8 **)(*in_RDI + 0x60);
  lVar5 = *(long *)(*in_RDI + 0x68);
  lVar6 = *(long *)(*in_RDI + 0x70);
  lVar7 = *(long *)(*in_RDI + 0x78);
  uVar8 = *(undefined8 *)(*in_RDI + 0x80);
  pdVar9 = *(double **)(*in_RDI + 0x88);
  uVar10 = *(undefined8 *)(*in_RDI + 0x90);
  lVar11 = *(long *)(*in_RDI + 0x50);
  lVar12 = *(long *)(*in_RDI + 0x58);
  uVar13 = *(undefined8 *)(*in_RDI + 0x30);
  uVar14 = *(undefined8 *)(*in_RDI + 0x48);
  pcVar15 = *(code **)(*in_RDI + 0x28);
  pcVar16 = *(code **)(*in_RDI + 0x40);
  piVar22 = (int *)(*in_RDI + 0x10);
  piVar23 = (int *)(*in_RDI + 0x14);
  lVar17 = *in_RDI;
  puVar18 = *(undefined8 **)(*in_RDI + 0x98);
  puVar19 = *(undefined8 **)(*in_RDI + 0xa0);
  *piVar23 = 0;
  bVar20 = false;
  bVar25 = true;
  if ((*(int *)(*in_RDI + 4) != 1) && (bVar25 = true, *(int *)(*in_RDI + 4) != 2)) {
    bVar25 = *(int *)(*in_RDI + 4) == 3;
  }
  if (*piVar22 == 0) {
    iVar21 = (*pcVar15)(uVar13,in_RDX,uVar10);
    if (iVar21 != 0) {
      *piVar22 = 0;
      uVar24 = 0x323;
      if (iVar21 < 0) {
        uVar24 = 0xfffffcdb;
      }
      *(undefined4 *)(*in_RDI + 0x20) = uVar24;
      return *(int *)(*in_RDI + 0x20);
    }
    N_VLinearSum(0x3ff0000000000000,0,in_RCX,uVar10,uVar10);
  }
  else {
    N_VScale(0x3ff0000000000000,in_RCX,uVar10);
  }
  if (lVar11 != 0) {
    N_VProd(lVar11,uVar10,*puVar4);
  }
  else {
    N_VScale(0x3ff0000000000000,uVar10,*puVar4);
  }
  __x = (double)N_VDotProd(*puVar4,*puVar4);
  if (0.0 < __x) {
    local_140 = sqrt(__x);
  }
  else {
    local_140 = 0.0;
  }
  local_a0 = local_140;
  *(double *)(lVar17 + 0x18) = local_140;
  if (in_XMM0_Qa < local_140) {
    local_b0 = local_140;
    N_VConst(uVar8);
    for (local_e4 = 0; local_e4 <= iVar2; local_e4 = local_e4 + 1) {
      for (local_cc = 0; local_cc <= iVar1; local_cc = local_cc + 1) {
        for (local_d0 = 0; local_d0 < iVar1; local_d0 = local_d0 + 1) {
          *(undefined8 *)(*(long *)(lVar6 + (long)local_cc * 8) + (long)local_d0 * 8) = 0;
        }
      }
      local_98 = 1.0;
      N_VScale(1.0 / local_a0,*puVar4,*puVar4);
      for (local_d8 = 0; local_d8 < iVar1; local_d8 = local_d8 + 1) {
        *piVar23 = *piVar23 + 1;
        local_e0 = local_d8 + 1;
        if (lVar12 == 0) {
          N_VScale(0x3ff0000000000000,puVar4[local_d8],uVar10);
        }
        else {
          N_VDiv(puVar4[local_d8],lVar12,uVar10);
        }
        if (bVar25) {
          N_VScale(0x3ff0000000000000,uVar10,puVar4[local_d8 + 1]);
          iVar21 = (*pcVar16)(in_XMM0_Qa,uVar14,puVar4[local_d8 + 1],uVar10,2);
          if (iVar21 != 0) {
            *piVar22 = 0;
            uVar24 = 0x325;
            if (iVar21 < 0) {
              uVar24 = 0xfffffcd8;
            }
            *(undefined4 *)(*in_RDI + 0x20) = uVar24;
            return *(int *)(*in_RDI + 0x20);
          }
        }
        N_VScale(0x3ff0000000000000,uVar10,*(undefined8 *)(lVar5 + (long)local_d8 * 8));
        iVar21 = (*pcVar15)(uVar13,uVar10,puVar4[local_d8 + 1]);
        if (iVar21 != 0) {
          *piVar22 = 0;
          uVar24 = 0x323;
          if (iVar21 < 0) {
            uVar24 = 0xfffffcdb;
          }
          *(undefined4 *)(*in_RDI + 0x20) = uVar24;
          return *(int *)(*in_RDI + 0x20);
        }
        if (lVar11 != 0) {
          N_VProd(lVar11,puVar4[local_d8 + 1],puVar4[local_d8 + 1]);
        }
        if (iVar3 == 2) {
          SUNClassicalGS(puVar4,lVar6,local_d8 + 1,iVar1,
                         *(long *)(lVar6 + (long)(local_d8 + 1) * 8) + (long)local_d8 * 8,puVar18,
                         puVar19);
        }
        else {
          SUNModifiedGS(puVar4,lVar6,local_d8 + 1,iVar1,
                        *(long *)(lVar6 + (long)(local_d8 + 1) * 8) + (long)local_d8 * 8);
        }
        iVar21 = SUNQRfact(local_e0,lVar6,lVar7,local_d8);
        if (iVar21 != 0) {
          *piVar22 = 0;
          *(undefined4 *)(*in_RDI + 0x20) = 0x327;
          return *(int *)(*in_RDI + 0x20);
        }
        local_98 = *(double *)(lVar7 + (long)(local_d8 * 2 + 1) * 8) * local_98;
        local_b0 = ABS(local_98 * local_a0);
        *(double *)(lVar17 + 0x18) = local_b0;
        if (local_b0 <= in_XMM0_Qa) {
          bVar20 = true;
          break;
        }
        N_VScale(1.0 / *(double *)(*(long *)(lVar6 + (long)(local_d8 + 1) * 8) + (long)local_d8 * 8)
                 ,puVar4[local_d8 + 1],puVar4[local_d8 + 1]);
      }
      *pdVar9 = local_a0;
      for (local_cc = 1; local_cc <= local_e0; local_cc = local_cc + 1) {
        pdVar9[local_cc] = 0.0;
      }
      iVar21 = SUNQRsol(local_e0,lVar6,lVar7,pdVar9);
      if (iVar21 != 0) {
        *piVar22 = 0;
        *(undefined4 *)(*in_RDI + 0x20) = 0xfffffcd5;
        return *(int *)(*in_RDI + 0x20);
      }
      *puVar18 = 0x3ff0000000000000;
      *puVar19 = uVar8;
      for (local_d4 = 0; local_d4 < local_e0; local_d4 = local_d4 + 1) {
        puVar18[local_d4 + 1] = pdVar9[local_d4];
        puVar19[local_d4 + 1] = *(undefined8 *)(lVar5 + (long)local_d4 * 8);
      }
      N_VLinearCombination(local_e0 + 1,puVar18,puVar19,uVar8);
      if (bVar20) {
        if (*piVar22 == 0) {
          N_VLinearSum(in_RDX,uVar8,in_RDX);
        }
        else {
          N_VScale(0x3ff0000000000000,uVar8,in_RDX);
        }
        *piVar22 = 0;
        *(undefined4 *)(*in_RDI + 0x20) = 0;
        return *(int *)(*in_RDI + 0x20);
      }
      if (local_e4 == iVar2) break;
      local_a8 = 1.0;
      for (local_cc = local_e0; 0 < local_cc; local_cc = local_cc + -1) {
        pdVar9[local_cc] = local_a8 * *(double *)(lVar7 + (long)(local_cc * 2 + -2) * 8);
        local_a8 = *(double *)(lVar7 + (long)(local_cc * 2 + -1) * 8) * local_a8;
      }
      *pdVar9 = local_a8;
      for (local_cc = 0; local_cc <= local_e0; local_cc = local_cc + 1) {
        pdVar9[local_cc] = local_a8 * local_a0 * pdVar9[local_cc];
      }
      local_a0 = ABS(local_a8 * local_a0);
      for (local_d4 = 0; local_d4 <= local_e0; local_d4 = local_d4 + 1) {
        puVar18[local_d4] = pdVar9[local_d4];
        puVar19[local_d4] = puVar4[local_d4];
      }
      N_VLinearCombination(local_e0 + 1,puVar18,puVar19,*puVar4);
    }
    if (local_140 <= local_b0) {
      *piVar22 = 0;
      *(undefined4 *)(*in_RDI + 0x20) = 0x322;
      local_4 = *(int *)(*in_RDI + 0x20);
    }
    else {
      if (*piVar22 == 0) {
        N_VLinearSum(in_RDX,uVar8,in_RDX);
      }
      else {
        N_VScale(0x3ff0000000000000,uVar8,in_RDX);
      }
      *piVar22 = 0;
      *(undefined4 *)(*in_RDI + 0x20) = 0x321;
      local_4 = *(int *)(*in_RDI + 0x20);
    }
  }
  else {
    *piVar22 = 0;
    *(undefined4 *)(*in_RDI + 0x20) = 0;
    local_4 = *(int *)(*in_RDI + 0x20);
  }
  return local_4;
}

Assistant:

int SUNLinSolSolve_SPFGMR(SUNLinearSolver S, SUNDIALS_MAYBE_UNUSED SUNMatrix A,
                          N_Vector x, N_Vector b, sunrealtype delta)
{
  SUNFunctionBegin(S->sunctx);

  /* local data and shortcut variables */
  N_Vector *V, *Z, xcor, vtemp, s1, s2;
  sunrealtype **Hes, *givens, *yg, *res_norm;
  sunrealtype beta, rotation_product, r_norm, s_product, rho;
  sunbooleantype preOnRight, scale1, scale2, converged;
  sunbooleantype* zeroguess;
  int i, j, k, l, l_max, krydim, ntries, max_restarts, gstype;
  int* nli;
  void *A_data, *P_data;
  SUNATimesFn atimes;
  SUNPSolveFn psolve;
  int status;

  /* local shortcuts for fused vector operations */
  sunrealtype* cv;
  N_Vector* Xv;

  /* Initialize some variables */
  krydim = 0;

  /* Make local shorcuts to solver variables. */
  l_max        = SPFGMR_CONTENT(S)->maxl;
  max_restarts = SPFGMR_CONTENT(S)->max_restarts;
  gstype       = SPFGMR_CONTENT(S)->gstype;
  V            = SPFGMR_CONTENT(S)->V;
  Z            = SPFGMR_CONTENT(S)->Z;
  Hes          = SPFGMR_CONTENT(S)->Hes;
  givens       = SPFGMR_CONTENT(S)->givens;
  xcor         = SPFGMR_CONTENT(S)->xcor;
  yg           = SPFGMR_CONTENT(S)->yg;
  vtemp        = SPFGMR_CONTENT(S)->vtemp;
  s1           = SPFGMR_CONTENT(S)->s1;
  s2           = SPFGMR_CONTENT(S)->s2;
  A_data       = SPFGMR_CONTENT(S)->ATData;
  P_data       = SPFGMR_CONTENT(S)->PData;
  atimes       = SPFGMR_CONTENT(S)->ATimes;
  psolve       = SPFGMR_CONTENT(S)->Psolve;
  zeroguess    = &(SPFGMR_CONTENT(S)->zeroguess);
  nli          = &(SPFGMR_CONTENT(S)->numiters);
  res_norm     = &(SPFGMR_CONTENT(S)->resnorm);
  cv           = SPFGMR_CONTENT(S)->cv;
  Xv           = SPFGMR_CONTENT(S)->Xv;

  /* Initialize counters and convergence flag */
  *nli      = 0;
  converged = SUNFALSE;

  /* Set sunbooleantype flags for internal solver options */
  preOnRight = ((SPFGMR_CONTENT(S)->pretype == SUN_PREC_LEFT) ||
                (SPFGMR_CONTENT(S)->pretype == SUN_PREC_RIGHT) ||
                (SPFGMR_CONTENT(S)->pretype == SUN_PREC_BOTH));
  scale1     = (s1 != NULL);
  scale2     = (s2 != NULL);

  /* Check if Atimes function has been set */
  SUNAssert(atimes, SUN_ERR_ARG_CORRUPT);

  /* If preconditioning, check if psolve has been set */
  SUNAssert(!preOnRight || psolve, SUN_ERR_ARG_CORRUPT);

  /* Set vtemp and V[0] to initial (unscaled) residual r_0 = b - A*x_0 */
  if (*zeroguess)
  {
    N_VScale(ONE, b, vtemp);
    SUNCheckLastErr();
  }
  else
  {
    status = atimes(A_data, x, vtemp);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;
      return (LASTFLAG(S));
    }
    N_VLinearSum(ONE, b, -ONE, vtemp, vtemp);
    SUNCheckLastErr();
  }

  /* Apply left scaling to vtemp = r_0 to fill V[0]. */
  if (scale1)
  {
    N_VProd(s1, vtemp, V[0]);
    SUNCheckLastErr();
  }
  else
  {
    N_VScale(ONE, vtemp, V[0]);
    SUNCheckLastErr();
  }

  /* Set r_norm = beta to L2 norm of V[0] = s1 r_0, and return if small */
  r_norm = N_VDotProd(V[0], V[0]);
  SUNCheckLastErr();
  *res_norm = r_norm = beta = SUNRsqrt(r_norm);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(S->sunctx->logger, SUN_LOGLEVEL_INFO,
                     "SUNLinSolSolve_SPFGMR", "initial-residual",
                     "nli = %li, resnorm = %.16g", (long int)0, *res_norm);
#endif

  if (r_norm <= delta)
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUN_SUCCESS;
    return (LASTFLAG(S));
  }

  /* Initialize rho to avoid compiler warning message */
  rho = beta;

  /* Set xcor = 0. */
  N_VConst(ZERO, xcor);
  SUNCheckLastErr();

  /* Begin outer iterations: up to (max_restarts + 1) attempts. */
  for (ntries = 0; ntries <= max_restarts; ntries++)
  {
    /* Initialize the Hessenberg matrix Hes and Givens rotation
       product.  Normalize the initial vector V[0].             */
    for (i = 0; i <= l_max; i++)
    {
      for (j = 0; j < l_max; j++) { Hes[i][j] = ZERO; }
    }
    rotation_product = ONE;
    N_VScale(ONE / r_norm, V[0], V[0]);
    SUNCheckLastErr();

    /* Inner loop: generate Krylov sequence and Arnoldi basis. */
    for (l = 0; l < l_max; l++)
    {
      (*nli)++;

      krydim = l + 1;

      /* Generate A-tilde V[l], where A-tilde = s1 A P_inv s2_inv. */

      /*   Apply right scaling: vtemp = s2_inv V[l]. */
      if (scale2)
      {
        N_VDiv(V[l], s2, vtemp);
        SUNCheckLastErr();
      }
      else
      {
        N_VScale(ONE, V[l], vtemp);
        SUNCheckLastErr();
      }

      /*   Apply right preconditioner: vtemp = Z[l] = P_inv s2_inv V[l]. */
      if (preOnRight)
      {
        N_VScale(ONE, vtemp, V[l + 1]);
        SUNCheckLastErr();
        status = psolve(P_data, V[l + 1], vtemp, delta, SUN_PREC_RIGHT);
        if (status != 0)
        {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                     : SUNLS_PSOLVE_FAIL_REC;
          return (LASTFLAG(S));
        }
      }
      N_VScale(ONE, vtemp, Z[l]);
      SUNCheckLastErr();

      /*   Apply A: V[l+1] = A P_inv s2_inv V[l]. */
      status = atimes(A_data, vtemp, V[l + 1]);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                   : SUNLS_ATIMES_FAIL_REC;
        return (LASTFLAG(S));
      }

      /*   Apply left scaling: V[l+1] = s1 A P_inv s2_inv V[l]. */
      if (scale1)
      {
        N_VProd(s1, V[l + 1], V[l + 1]);
        SUNCheckLastErr();
      }

      /* Orthogonalize V[l+1] against previous V[i]: V[l+1] = w_tilde. */
      if (gstype == SUN_CLASSICAL_GS)
      {
        SUNCheckCall(
          SUNClassicalGS(V, Hes, l + 1, l_max, &(Hes[l + 1][l]), cv, Xv));
      }
      else
      {
        SUNCheckCall(SUNModifiedGS(V, Hes, l + 1, l_max, &(Hes[l + 1][l])));
      }

      /* Update the QR factorization of Hes. */
      if (SUNQRfact(krydim, Hes, givens, l) != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = SUNLS_QRFACT_FAIL;
        return (LASTFLAG(S));
      }

      /* Update residual norm estimate; break if convergence test passes. */
      rotation_product *= givens[2 * l + 1];
      *res_norm = rho = SUNRabs(rotation_product * r_norm);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
      SUNLogger_QueueMsg(S->sunctx->logger, SUN_LOGLEVEL_INFO,
                         "SUNLinSolSolve_SPFGMR", "iterate-residual",
                         "nli = %li, resnorm = %.16g", (long int)0, *res_norm);
#endif

      if (rho <= delta)
      {
        converged = SUNTRUE;
        break;
      }

      /* Normalize V[l+1] with norm value from the Gram-Schmidt routine. */
      N_VScale(ONE / Hes[l + 1][l], V[l + 1], V[l + 1]);
      SUNCheckLastErr();
    }

    /* Inner loop is done.  Compute the new correction vector xcor. */

    /*   Construct g, then solve for y. */
    yg[0] = r_norm;
    for (i = 1; i <= krydim; i++) { yg[i] = ZERO; }
    if (SUNQRsol(krydim, Hes, givens, yg) != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = SUNLS_QRSOL_FAIL;
      return (LASTFLAG(S));
    }

    /*   Add correction vector Z_l y to xcor. */
    cv[0] = ONE;
    Xv[0] = xcor;

    for (k = 0; k < krydim; k++)
    {
      cv[k + 1] = yg[k];
      Xv[k + 1] = Z[k];
    }
    SUNCheckCall(N_VLinearCombination(krydim + 1, cv, Xv, xcor));

    /* If converged, construct the final solution vector x and return. */
    if (converged)
    {
      if (*zeroguess)
      {
        N_VScale(ONE, xcor, x);
        SUNCheckLastErr();
      }
      else
      {
        N_VLinearSum(ONE, x, ONE, xcor, x);
        SUNCheckLastErr();
      }
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = SUN_SUCCESS;
      return (LASTFLAG(S));
    }

    /* Not yet converged; if allowed, prepare for restart. */
    if (ntries == max_restarts) { break; }

    /* Construct last column of Q in yg. */
    s_product = ONE;
    for (i = krydim; i > 0; i--)
    {
      yg[i] = s_product * givens[2 * i - 2];
      s_product *= givens[2 * i - 1];
    }
    yg[0] = s_product;

    /* Scale r_norm and yg. */
    r_norm *= s_product;
    for (i = 0; i <= krydim; i++) { yg[i] *= r_norm; }
    r_norm = SUNRabs(r_norm);

    /* Multiply yg by V_(krydim+1) to get last residual vector; restart. */
    for (k = 0; k <= krydim; k++)
    {
      cv[k] = yg[k];
      Xv[k] = V[k];
    }
    SUNCheckCall(N_VLinearCombination(krydim + 1, cv, Xv, V[0]));
  }

  /* Failed to converge, even after allowed restarts.
     If the residual norm was reduced below its initial value, compute
     and return x anyway.  Otherwise return failure flag. */
  if (rho < beta)
  {
    if (*zeroguess)
    {
      N_VScale(ONE, xcor, x);
      SUNCheckLastErr();
    }
    else
    {
      N_VLinearSum(ONE, x, ONE, xcor, x);
      SUNCheckLastErr();
    }
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUNLS_RES_REDUCED;
    return (LASTFLAG(S));
  }

  *zeroguess  = SUNFALSE;
  LASTFLAG(S) = SUNLS_CONV_FAIL;
  return (LASTFLAG(S));
}